

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Mem * columnMem(sqlite3_stmt *pStmt,int i)

{
  Mem *local_30;
  Mem *pOut;
  Vdbe *pVm;
  int i_local;
  sqlite3_stmt *pStmt_local;
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    pStmt_local = (sqlite3_stmt *)columnNullValue();
  }
  else {
    sqlite3_mutex_enter(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    if (((*(long *)(pStmt + 0xa0) == 0) || ((int)(uint)*(ushort *)(pStmt + 0xc0) <= i)) || (i < 0))
    {
      sqlite3Error(*(sqlite3 **)pStmt,0x19);
      local_30 = columnNullValue();
    }
    else {
      local_30 = (Mem *)(*(long *)(pStmt + 0xa0) + (long)i * 0x38);
    }
    pStmt_local = (sqlite3_stmt *)local_30;
  }
  return (Mem *)pStmt_local;
}

Assistant:

static Mem *columnMem(sqlite3_stmt *pStmt, int i){
  Vdbe *pVm;
  Mem *pOut;

  pVm = (Vdbe *)pStmt;
  if( pVm==0 ) return (Mem*)columnNullValue();
  assert( pVm->db );
  sqlite3_mutex_enter(pVm->db->mutex);
  if( pVm->pResultSet!=0 && i<pVm->nResColumn && i>=0 ){
    pOut = &pVm->pResultSet[i];
  }else{
    sqlite3Error(pVm->db, SQLITE_RANGE);
    pOut = (Mem*)columnNullValue();
  }
  return pOut;
}